

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
::clear(raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
        *this)

{
  size_t sVar1;
  size_t i;
  size_t sVar2;
  
  if (this->size_ == 0) {
    return;
  }
  sVar1 = this->capacity_;
  if (sVar1 != 0) {
    sVar2 = 0;
    do {
      if (-1 < this->ctrl_[sVar2]) {
        operator_delete(this->slots_[sVar2],8);
        sVar1 = this->capacity_;
      }
      sVar2 = sVar2 + 1;
    } while (sVar2 != sVar1);
    this->size_ = 0;
    memset(this->ctrl_,0x80,sVar1 + 0x10);
    this->ctrl_[sVar1] = -1;
    reset_growth_left(this,this->capacity_);
    if (this->size_ == 0) {
      return;
    }
  }
  __assert_fail("empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x50a,
                "void phmap::priv::raw_hash_set<phmap::priv::NodeHashMapPolicy<int, int>, phmap::priv::StatefulTestingHash, phmap::priv::StatefulTestingEqual, phmap::priv::Alloc<std::pair<const int, int>>>::clear() [Policy = phmap::priv::NodeHashMapPolicy<int, int>, Hash = phmap::priv::StatefulTestingHash, Eq = phmap::priv::StatefulTestingEqual, Alloc = phmap::priv::Alloc<std::pair<const int, int>>]"
               );
}

Assistant:

bool empty() const { return !size(); }